

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float in_XMM0_Da;
  float fVar3;
  float center_x_ratio_00;
  float last_item_width;
  float target_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  fVar3 = (pIVar1->DC).LastItemRect.Min.x - (pIVar1->Pos).x;
  center_x_ratio_00 = ImRect::GetWidth(&(pIVar1->DC).LastItemRect);
  SetScrollFromPosX(center_x_ratio_00 * in_XMM0_Da +
                    (pIVar2->Style).ItemSpacing.x * (in_XMM0_Da - 0.5) * 2.0 + fVar3,
                    center_x_ratio_00);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float target_x = window->DC.LastItemRect.Min.x - window->Pos.x; // Left of last item, in window space
    float last_item_width = window->DC.LastItemRect.GetWidth();
    target_x += (last_item_width * center_x_ratio) + (g.Style.ItemSpacing.x * (center_x_ratio - 0.5f) * 2.0f); // Precisely aim before, in the middle or after the last item.
    SetScrollFromPosX(target_x, center_x_ratio);
}